

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall xmrig::Network::onActive(Network *this,IStrategy *strategy,IClient *client)

{
  undefined *puVar1;
  uint16_t uVar2;
  char *pcVar3;
  undefined8 uVar4;
  String *pSVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  long *in_RDX;
  char *fingerprint;
  char *tlsVersion;
  IClient *in_stack_ffffffffffffffa8;
  NetworkState *in_stack_ffffffffffffffb0;
  
  NetworkState::onActive(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pcVar3 = (char *)(**(code **)(*in_RDX + 0x40))();
  puVar1 = tag;
  uVar4 = (**(code **)(*in_RDX + 0x30))();
  (**(code **)(*in_RDX + 0x50))();
  pSVar5 = Pool::host((Pool *)0x236285);
  pcVar6 = String::data(pSVar5);
  (**(code **)(*in_RDX + 0x50))();
  uVar2 = Pool::port((Pool *)0x2362a5);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "";
  }
  pSVar5 = (String *)(**(code **)(*in_RDX + 0x58))();
  pcVar7 = String::data(pSVar5);
  Log::print(INFO,
             "%s \x1b[1;37muse %s \x1b[0m\x1b[1;36m%s:%d \x1b[0m\x1b[1;32m%s\x1b[0m \x1b[1;30m%s\x1b[0m"
             ,puVar1,uVar4,pcVar6,(ulong)uVar2,pcVar3,pcVar7);
  lVar8 = (**(code **)(*in_RDX + 0x38))();
  if (lVar8 != 0) {
    Log::print(INFO,"%s \x1b[1;30mfingerprint (SHA-256): \"%s\"\x1b[0m",tag,lVar8);
  }
  return;
}

Assistant:

void xmrig::Network::onActive(IStrategy *strategy, IClient *client)
{
    m_state.onActive(client);

    const char *tlsVersion = client->tlsVersion();
    LOG_INFO("%s " WHITE_BOLD("use %s ") CYAN_BOLD("%s:%d ") GREEN_BOLD("%s") " " BLACK_BOLD("%s"),
             tag, client->mode(), client->pool().host().data(), client->pool().port(), tlsVersion ? tlsVersion : "", client->ip().data());

    const char *fingerprint = client->tlsFingerprint();
    if (fingerprint != nullptr) {
        LOG_INFO("%s " BLACK_BOLD("fingerprint (SHA-256): \"%s\""), tag, fingerprint);
    }
}